

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JsonObjectWriter::~JsonObjectWriter(JsonObjectWriter *this)

{
  ostream *poVar1;
  uint64_t uVar2;
  char local_22;
  char local_21;
  
  if (this->m_active == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,&local_22,1);
    uVar2 = this->m_indent_level;
    if (uVar2 != 0) {
      poVar1 = this->m_os;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,&local_21,1);
  }
  return;
}

Assistant:

JsonObjectWriter::~JsonObjectWriter() {
        if ( !m_active ) { return; }

        m_os << '\n';
        JsonUtils::indent( m_os, m_indent_level );
        m_os << '}';
    }